

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLNode::~XMLNode(XMLNode *this)

{
  XMLNode *this_local;
  
  this->_vptr_XMLNode = (_func_int **)&PTR_ToElement_0029c4d0;
  DeleteChildren(this);
  if (this->_parent != (XMLNode *)0x0) {
    Unlink(this->_parent,this);
  }
  StrPair::~StrPair(&this->_value);
  return;
}

Assistant:

XMLNode::~XMLNode()
{
    DeleteChildren();
    if ( _parent ) {
        _parent->Unlink( this );
    }
}